

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallProgramsCommand.cxx
# Opt level: O2

bool cmInstallProgramsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  pointer pbVar1;
  cmGlobalGenerator *pcVar2;
  string *component;
  string *this_00;
  ulong uVar3;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  finalArgs;
  GeneratorAction local_a0;
  allocator<char> local_58 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  uVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"called with incorrect number of arguments",local_58);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    this = status->Makefile;
    pcVar2 = cmMakefile::GetGlobalGenerator(this);
    cmGlobalGenerator::EnableInstallTarget(pcVar2);
    pcVar2 = cmMakefile::GetGlobalGenerator(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"CMAKE_INSTALL_DEFAULT_COMPONENT_NAME",local_58);
    component = cmMakefile::GetSafeDefinition(this,(string *)&local_a0);
    cmGlobalGenerator::AddInstallComponent(pcVar2,component);
    std::__cxx11::string::~string((string *)&local_a0);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&finalArgs,
               pbVar1 + 1,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_a0);
    std::__cxx11::string::string((string *)local_58,(string *)pbVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,&finalArgs);
    local_c8 = (code *)0x0;
    pcStack_c0 = (code *)0x0;
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    this_00 = (string *)operator_new(0x38);
    std::__cxx11::string::string(this_00,(string *)local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(this_00 + 0x20),&local_38);
    pcStack_c0 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallProgramsCommand.cxx:42:5)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallProgramsCommand.cxx:42:5)>
               ::_M_manager;
    local_d8._M_unused._0_8_ = (undefined8)this_00;
    cmMakefile::GeneratorAction::GeneratorAction(&local_a0,(ActionT *)&local_d8);
    cmMakefile::AddGeneratorAction(this,&local_a0);
    cmMakefile::GeneratorAction::~GeneratorAction(&local_a0);
    std::_Function_base::~_Function_base((_Function_base *)&local_d8);
    cmInstallProgramsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::$_0::~__0((__0 *)local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&finalArgs);
  }
  return 0x20 < uVar3;
}

Assistant:

bool cmInstallProgramsCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Enable the install target.
  mf.GetGlobalGenerator()->EnableInstallTarget();

  mf.GetGlobalGenerator()->AddInstallComponent(
    mf.GetSafeDefinition("CMAKE_INSTALL_DEFAULT_COMPONENT_NAME"));

  std::string const& dest = args[0];
  std::vector<std::string> const finalArgs(args.begin() + 1, args.end());
  mf.AddGeneratorAction(
    [dest, finalArgs](cmLocalGenerator& lg, const cmListFileBacktrace&) {
      FinalAction(*lg.GetMakefile(), dest, finalArgs);
    });
  return true;
}